

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MilStorage.cpp
# Opt level: O3

u_int64_t __thiscall
CoreML::MilStoragePython::MilStoragePythonWriter::write_uint4_data
          (MilStoragePythonWriter *this,array_t<unsigned_char,_16> *data)

{
  _Head_base<0UL,_MILBlob::Blob::StorageWriter_*,_false> this_00;
  PyObject *pPVar1;
  uint64_t uVar2;
  PyObject *pPVar3;
  SpanSize<18446744073709551615UL> SVar4;
  SpanSize<18446744073709551615UL> SVar5;
  pointer ptVar6;
  Util *this_01;
  long lVar7;
  Span<const_unsigned_char,_18446744073709551615UL> unpackedValues;
  Span<const_unsigned_char,_18446744073709551615UL> span;
  Span<const_MILBlob::UInt4,_18446744073709551615UL> data_00;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_38;
  
  pPVar3 = (data->super_array).super_buffer.super_object.super_handle.m_ptr;
  ptVar6 = (pointer)pPVar3[1].ob_refcnt;
  SVar5.m_size = 1;
  if ((long)*(int *)&pPVar3[1].ob_type == 0) {
    SVar4.m_size = 1;
  }
  else {
    SVar4.m_size = 1;
    lVar7 = 0;
    do {
      SVar4.m_size = SVar4.m_size * *(long *)(pPVar3[2].ob_refcnt + lVar7);
      lVar7 = lVar7 + 8;
    } while ((long)*(int *)&pPVar3[1].ob_type * 8 != lVar7);
    if (SVar4.m_size == 0) {
      ptVar6 = (pointer)0x0;
    }
  }
  this_00._M_head_impl =
       (this->m_writer)._M_t.
       super___uniq_ptr_impl<MILBlob::Blob::StorageWriter,_std::default_delete<MILBlob::Blob::StorageWriter>_>
       ._M_t.
       super__Tuple_impl<0UL,_MILBlob::Blob::StorageWriter_*,_std::default_delete<MILBlob::Blob::StorageWriter>_>
       .super__Head_base<0UL,_MILBlob::Blob::StorageWriter_*,_false>._M_head_impl;
  unpackedValues.m_size.m_size = SVar4.m_size;
  unpackedValues.m_ptr = ptVar6;
  MILBlob::PackUInt8Span<MILBlob::UInt4>(&local_38,unpackedValues);
  span.m_ptr = local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish +
               -(long)local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start;
  this_01 = (Util *)0x0;
  if (span.m_ptr != (pointer)0x0) {
    this_01 = (Util *)local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start;
  }
  pPVar3 = (data->super_array).super_buffer.super_object.super_handle.m_ptr;
  pPVar1 = pPVar3 + 1;
  if ((long)*(int *)&pPVar1->ob_type != 0) {
    pPVar3 = (PyObject *)pPVar3[2].ob_refcnt;
    SVar5.m_size = 1;
    lVar7 = 0;
    do {
      SVar5.m_size = SVar5.m_size * *(long *)((long)&pPVar3->ob_refcnt + lVar7);
      lVar7 = lVar7 + 8;
    } while ((long)*(int *)&pPVar1->ob_type * 8 != lVar7);
  }
  span.m_size.m_size = SVar5.m_size;
  data_00 = MILBlob::Util::CastToBitSpan<const_MILBlob::UInt4,_const_unsigned_char,_true>
                      (this_01,span,(size_t)pPVar3);
  uVar2 = MILBlob::Blob::StorageWriter::WriteData<MILBlob::UInt4>(this_00._M_head_impl,data_00);
  if ((Util *)local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start != (Util *)0x0) {
    operator_delete(local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return uVar2;
}

Assistant:

u_int64_t MilStoragePythonWriter::write_uint4_data(const py::array_t<uint8_t>& data) {
    return writeUnsignedSubByteData<MILBlob::UInt4>(*m_writer, data);
}